

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
ModbusSimulationDataGenerator::Initialize
          (ModbusSimulationDataGenerator *this,U32 simulation_sample_rate,
          ModbusAnalyzerSettings *settings)

{
  U32 UVar1;
  U64 UVar2;
  BitState BVar3;
  BitState BVar4;
  bool bVar5;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init((double)settings->mBitRate,(int)this + 0x28);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mModbusSimulationData);
  BVar4 = (BitState)&this->mModbusSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar4);
  BVar3 = (BitState)this->mSettings->mInverted;
  this->mBitLow = BVar3;
  this->mBitHigh = BVar3 ^ BIT_HIGH;
  SimulationChannelDescriptor::SetInitialBitState(BVar4);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance(BVar4);
  this->mValue = 0;
  this->mNumBitsMask = 0;
  UVar1 = this->mSettings->mBitsPerTransfer;
  UVar2 = 0;
  while (bVar5 = UVar1 != 0, UVar1 = UVar1 - 1, bVar5) {
    UVar2 = UVar2 * 2 + 1;
    this->mNumBitsMask = UVar2;
  }
  init_crc16_tab(this);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::Initialize( U32 simulation_sample_rate, ModbusAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( mSettings->mBitRate, simulation_sample_rate );
    mModbusSimulationData.SetChannel( mSettings->mInputChannel );
    mModbusSimulationData.SetSampleRate( simulation_sample_rate );

    if( mSettings->mInverted == false )
    {
        mBitLow = BIT_LOW;
        mBitHigh = BIT_HIGH;
    }
    else
    {
        mBitLow = BIT_HIGH;
        mBitHigh = BIT_LOW;
    }

    mModbusSimulationData.SetInitialBitState( mBitHigh );
    mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

    mValue = 0;
    mNumBitsMask = 0;

    U32 num_bits = mSettings->mBitsPerTransfer;
    for( U32 i = 0; i < num_bits; i++ )
    {
        mNumBitsMask <<= 1;
        mNumBitsMask |= 0x1;
    }

    // used for calculating Modbus Checksum values
    init_crc16_tab();
}